

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *header)

{
  bool bVar1;
  Header *in_RDI;
  int version;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            ((OStream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  uVar2 = 2;
  bVar1 = Header::hasType((Header *)0xabb6f4);
  if (bVar1) {
    Header::type_abi_cxx11_((Header *)0xabb704);
    bVar1 = isDeepData((string *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    if (bVar1) {
      uVar2 = uVar2 | 0x800;
      goto LAB_00abb740;
    }
  }
  bVar1 = Header::hasTileDescription((Header *)0xabb72b);
  if (bVar1) {
    uVar2 = uVar2 | 0x200;
  }
LAB_00abb740:
  bVar1 = usesLongNames(in_RDI);
  if (bVar1) {
    uVar2 = uVar2 | 0x400;
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            ((OStream *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, const Header& header)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (header.hasType() && isDeepData(header.type()))
    {
        version |= NON_IMAGE_FLAG;
    }
    else
    {
        // (TODO) we may want to check something else in function signature
        // instead of hasTileDescription()?
        if (header.hasTileDescription())
            version |= TILED_FLAG;
    }

    if (usesLongNames (header))
        version |= LONG_NAMES_FLAG;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}